

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
::
if_contains<phmap::priv::(anonymous_namespace)::Entry,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_IfContains_Test::TestBody()::__0&>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
           *this,key_arg<phmap::priv::(anonymous_namespace)::Entry> *key,anon_class_8_1_ba1d8281 *f)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_t in_RAX;
  ulong uVar3;
  long lVar4;
  size_t hashval;
  size_t offset;
  size_t local_28;
  
  uVar3 = (long)key->key * -0x395b586ca42e166b;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (uVar3 >> 0x2f ^ uVar3) * 0x35a98f4d286a90b9 + 0xe6546b64;
  hashval = SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
            SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0);
  uVar3 = (ulong)((((uint)(hashval >> 0x18) & 0xff ^
                   (uint)(hashval >> 8) & 0xffffff ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x30
                 );
  local_28 = in_RAX;
  bVar2 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
          ::find_impl<phmap::priv::(anonymous_namespace)::Entry>
                    ((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
                      *)(this + uVar3),key,hashval,&local_28);
  lVar4 = 0;
  if (bVar2) {
    lVar4 = local_28 * 8 + *(long *)(this + uVar3 + 8);
  }
  if (lVar4 != 0) {
    *f->val = *(int *)(lVar4 + 4);
  }
  return lVar4 != 0;
}

Assistant:

bool if_contains(const key_arg<K>& key, F&& f) const {
        return const_cast<parallel_hash_set*>(this)->template 
            modify_if_impl<K, F, SharedLock>(key, std::forward<F>(f));
    }